

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# addTargets.hpp
# Opt level: O0

bool helics::
     addTargets<helics::Federate::registerConnectorInterfacesJsonDetail(helics::fileops::JsonBuffer_const&)::__7>
               (json *section,string *targetName,anon_class_8_1_36d583d8 callback)

{
  bool bVar1;
  reference pvVar2;
  key_type *in_RSI;
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
  *target;
  iterator __end4;
  iterator __begin4;
  value_type *__range4;
  value_type targets;
  bool found;
  iter_impl<nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>
  *in_stack_fffffffffffffee8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffef0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *this;
  string *in_stack_fffffffffffffef8;
  undefined7 in_stack_ffffffffffffff00;
  undefined1 in_stack_ffffffffffffff07;
  _Alloc_hider in_stack_ffffffffffffff10;
  key_type *in_stack_ffffffffffffff38;
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
  *in_stack_ffffffffffffff40;
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
  *in_stack_ffffffffffffff48;
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
  *in_stack_ffffffffffffff50;
  iter_impl<nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>
  *in_stack_ffffffffffffff78;
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
  local_30;
  byte local_19;
  
  local_19 = 0;
  bVar1 = nlohmann::json_abi_v3_11_3::
          basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
          ::contains((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                      *)in_stack_ffffffffffffff10._M_p,in_RSI);
  if (bVar1) {
    nlohmann::json_abi_v3_11_3::
    basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
    ::operator[](in_stack_ffffffffffffff40,in_stack_ffffffffffffff38);
    nlohmann::json_abi_v3_11_3::
    basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
    ::basic_json(in_stack_ffffffffffffff50,in_stack_ffffffffffffff48);
    bVar1 = nlohmann::json_abi_v3_11_3::
            basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
            ::is_array(&local_30);
    if (bVar1) {
      nlohmann::json_abi_v3_11_3::
      basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
      ::begin((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
               *)in_stack_fffffffffffffef8);
      nlohmann::json_abi_v3_11_3::
      basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
      ::end((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
             *)in_stack_fffffffffffffef8);
      while (in_stack_ffffffffffffff07 =
                  nlohmann::json_abi_v3_11_3::detail::
                  iter_impl<nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>
                  ::
                  operator!=<nlohmann::json_abi_v3_11_3::detail::iter_impl<nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>,_nullptr>
                            ((iter_impl<nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>
                              *)in_stack_fffffffffffffef0,in_stack_fffffffffffffee8),
            (bool)in_stack_ffffffffffffff07) {
        in_stack_fffffffffffffef8 =
             (string *)
             nlohmann::json_abi_v3_11_3::detail::
             iter_impl<nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>
             ::operator*(in_stack_ffffffffffffff78);
        nlohmann::json_abi_v3_11_3::
        basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
        ::get<std::__cxx11::string,std::__cxx11::string>
                  ((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                    *)in_stack_fffffffffffffef8);
        Federate::registerConnectorInterfacesJsonDetail::anon_class_8_1_36d583d8::operator()
                  ((anon_class_8_1_36d583d8 *)
                   CONCAT17(in_stack_ffffffffffffff07,in_stack_ffffffffffffff00),
                   in_stack_fffffffffffffef8);
        std::__cxx11::string::~string(in_stack_fffffffffffffef0);
        nlohmann::json_abi_v3_11_3::detail::
        iter_impl<nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>
        ::operator++((iter_impl<nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>
                      *)in_stack_fffffffffffffef0);
      }
    }
    else {
      nlohmann::json_abi_v3_11_3::
      basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
      ::get<std::__cxx11::string,std::__cxx11::string>
                ((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                  *)in_stack_fffffffffffffef8);
      Federate::registerConnectorInterfacesJsonDetail::anon_class_8_1_36d583d8::operator()
                ((anon_class_8_1_36d583d8 *)
                 CONCAT17(in_stack_ffffffffffffff07,in_stack_ffffffffffffff00),
                 in_stack_fffffffffffffef8);
      std::__cxx11::string::~string(in_stack_fffffffffffffef0);
    }
    local_19 = 1;
    nlohmann::json_abi_v3_11_3::
    basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
    ::~basic_json((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                   *)in_stack_fffffffffffffef0);
  }
  pvVar2 = CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
           back(in_stack_fffffffffffffef0);
  if (*pvVar2 == 's') {
    CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::pop_back
              (in_stack_fffffffffffffef0);
    bVar1 = nlohmann::json_abi_v3_11_3::
            basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
            ::contains((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                        *)in_stack_ffffffffffffff10._M_p,in_RSI);
    if (bVar1) {
      nlohmann::json_abi_v3_11_3::
      basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
      ::operator[](in_stack_ffffffffffffff40,in_stack_ffffffffffffff38);
      this = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             &stack0xffffffffffffff10;
      nlohmann::json_abi_v3_11_3::
      basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
      ::get<std::__cxx11::string,std::__cxx11::string>
                ((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                  *)in_stack_fffffffffffffef8);
      Federate::registerConnectorInterfacesJsonDetail::anon_class_8_1_36d583d8::operator()
                ((anon_class_8_1_36d583d8 *)
                 CONCAT17(in_stack_ffffffffffffff07,in_stack_ffffffffffffff00),
                 in_stack_fffffffffffffef8);
      std::__cxx11::string::~string(this);
      local_19 = 1;
    }
  }
  return (bool)(local_19 & 1);
}

Assistant:

bool addTargets(const nlohmann::json& section, std::string targetName, Callable callback)
{
    bool found{false};
    // There should probably be a static_assert here but there isn't a nice type trait to check that
    if (section.contains(targetName)) {
        auto targets = section[targetName];
        if (targets.is_array()) {
            for (const auto& target : targets) {
                callback(target.get<std::string>());
            }
        } else {
            callback(targets.get<std::string>());
        }
        found = true;
    }
    if (targetName.back() == 's') {
        targetName.pop_back();
        if (section.contains(targetName)) {
            callback(section[targetName].get<std::string>());
            found = true;
        }
    }
    return found;
}